

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

size_t default_decrypt_cid(quicly_cid_encryptor_t *_self,quicly_cid_plaintext_t *plaintext,
                          void *encrypted,size_t len)

{
  uint32_t uVar1;
  uint64_t uVar2;
  byte *in_RCX;
  uint32_t *in_RSI;
  long in_RDI;
  uint8_t *p;
  uint8_t ptbuf [16];
  st_quicly_default_encrypt_cid_t *self;
  size_t in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  byte *pbVar3;
  void *in_stack_ffffffffffffffb8;
  ptls_cipher_context_t *in_stack_ffffffffffffffc0;
  byte *local_28;
  
  if (in_RCX == (byte *)0x0) {
    local_28 = *(byte **)(**(long **)(in_RDI + 0x20) + 0x10);
  }
  else {
    local_28 = in_RCX;
    if (in_RCX != *(byte **)(**(long **)(in_RDI + 0x20) + 0x10)) {
      return 0xffffffffffffffff;
    }
  }
  ptls_cipher_encrypt(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
  pbVar3 = &stack0xffffffffffffffb8;
  if (local_28 == (byte *)0x10) {
    uVar2 = quicly_decode64((uint8_t **)&stack0xffffffffffffffb0);
    *(uint64_t *)(in_RSI + 2) = uVar2;
  }
  else {
    in_RSI[2] = 0;
    in_RSI[3] = 0;
  }
  uVar1 = quicly_decode32((uint8_t **)&stack0xffffffffffffffb0);
  *in_RSI = uVar1;
  uVar1 = quicly_decode24((uint8_t **)&stack0xffffffffffffffb0);
  in_RSI[1] = in_RSI[1] & 0xff | uVar1 << 8;
  in_RSI[1] = in_RSI[1] & 0xffffff00 | (uint)*pbVar3;
  if (pbVar3 + (1 - (long)&stack0xffffffffffffffb8) == local_28) {
    return (size_t)local_28;
  }
  __assert_fail("p - ptbuf == len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                ,0xad,
                "size_t default_decrypt_cid(quicly_cid_encryptor_t *, quicly_cid_plaintext_t *, const void *, size_t)"
               );
}

Assistant:

static size_t default_decrypt_cid(quicly_cid_encryptor_t *_self, quicly_cid_plaintext_t *plaintext, const void *encrypted,
                                  size_t len)
{
    struct st_quicly_default_encrypt_cid_t *self = (void *)_self;
    uint8_t ptbuf[16];
    const uint8_t *p;

    if (len != 0) {
        /* long header packet; decrypt only if given Connection ID matches the expected size */
        if (len != self->cid_decrypt_ctx->algo->block_size)
            return SIZE_MAX;
    } else {
        /* short header packet; we are the one to name the size */
        len = self->cid_decrypt_ctx->algo->block_size;
    }

    /* decrypt */
    ptls_cipher_encrypt(self->cid_decrypt_ctx, ptbuf, encrypted, len);

    /* decode */
    p = ptbuf;
    if (len == 16) {
        plaintext->node_id = quicly_decode64(&p);
    } else {
        plaintext->node_id = 0;
    }
    plaintext->master_id = quicly_decode32(&p);
    plaintext->thread_id = quicly_decode24(&p);
    plaintext->path_id = *p++;
    assert(p - ptbuf == len);

    return len;
}